

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

db_bit_type __thiscall lan::db::convert_to_bit_type(db *this,char type)

{
  int iVar1;
  long lVar2;
  undefined7 in_register_00000031;
  
  iVar1 = tolower((int)CONCAT71(in_register_00000031,type));
  lVar2 = 0;
  do {
    if ((char)iVar1 == (&db_bit_table)[lVar2]) goto LAB_00105516;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xb);
  lVar2 = 8;
LAB_00105516:
  return (db_bit_type)lVar2;
}

Assistant:

lan::db_bit_type db::convert_to_bit_type(char type){
            type = std::tolower(type);
            for(uint i = Bool ; i <= Container ; i++ )
                if(type == db_bit_table[i])
                    return (db_bit_type)i;
                return Unsafe;
        }